

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void anon_unknown.dwarf_7445::ForwardFFT(fft_plan p)

{
  int in_stack_00000008;
  int local_18;
  int local_14;
  int i_3;
  int i_2;
  int i_1;
  int i;
  
  if (p._8_8_ == 0) {
    for (i_2 = 0; i_2 < in_stack_00000008; i_2 = i_2 + 1) {
      p.out[i_2] = (*p.c_in)[i_2];
    }
    rdft(in_stack_00000008,1,p.out,(int *)p.input,(double *)p.ip);
    *p.in = *p.out;
    p.in[1] = 0.0;
    for (i_3 = 1; i_3 < in_stack_00000008 / 2; i_3 = i_3 + 1) {
      p.in[(long)i_3 * 2] = p.out[i_3 << 1];
      p.in[(long)i_3 * 2 + 1] = -p.out[i_3 * 2 + 1];
    }
    p.in[(long)(in_stack_00000008 / 2) * 2] = p.out[1];
    p.in[(long)(in_stack_00000008 / 2) * 2 + 1] = 0.0;
  }
  else {
    for (local_14 = 0; local_14 < in_stack_00000008; local_14 = local_14 + 1) {
      p.out[local_14 << 1] = *(double *)(p._8_8_ + (long)local_14 * 0x10);
      p.out[local_14 * 2 + 1] = *(double *)(p._8_8_ + (long)local_14 * 0x10 + 8);
    }
    cdft(in_stack_00000008 << 1,1,p.out,(int *)p.input,(double *)p.ip);
    for (local_18 = 0; local_18 < in_stack_00000008; local_18 = local_18 + 1) {
      p.in[(long)local_18 * 2] = p.out[local_18 << 1];
      p.in[(long)local_18 * 2 + 1] = -p.out[local_18 * 2 + 1];
    }
  }
  return;
}

Assistant:

static void ForwardFFT(fft_plan p) {
  if (p.c_in == NULL) {  // r2c
    for (int i = 0; i < p.n; ++i) p.input[i] = p.in[i];
    rdft(p.n, 1, p.input, p.ip, p.w);
    p.c_out[0][0] = p.input[0];
    p.c_out[0][1] = 0.0;
    for (int i = 1; i < p.n / 2; ++i) {
      p.c_out[i][0] = p.input[i * 2];
      p.c_out[i][1] = -p.input[i * 2 + 1];
    }
    p.c_out[p.n / 2][0] = p.input[1];
    p.c_out[p.n / 2][1] = 0.0;
  } else {  // c2c
    for (int i = 0; i < p.n; ++i) {
      p.input[i * 2] = p.c_in[i][0];
      p.input[i * 2 + 1] = p.c_in[i][1];
    }
    cdft(p.n * 2, 1, p.input, p.ip, p.w);
    for (int i = 0; i < p.n; ++i) {
      p.c_out[i][0] = p.input[i * 2];
      p.c_out[i][1] = -p.input[i * 2 + 1];
    }
  }
}